

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall
RegisterParserTestInclude::RegisterParserTestInclude(RegisterParserTestInclude *this)

{
  RegisterParserTestInclude *this_local;
  
  RegisterTest(ParserTestInclude::Create,"ParserTest.Include");
  return;
}

Assistant:

TEST_F(ParserTest, Include) {
  fs_.Create("include.ninja", "var = inner\n");
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"var = outer\n"
"include include.ninja\n"));

  ASSERT_EQ(1u, fs_.files_read_.size());
  EXPECT_EQ("include.ninja", fs_.files_read_[0]);
  EXPECT_EQ("inner", state.bindings_.LookupVariable("var"));
}